

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::group::depth_first_traverser::is_last_in_path(depth_first_traverser *this)

{
  bool bVar1;
  const_reference pvVar2;
  pointer this_00;
  value_type *top;
  reference local_38;
  context *t;
  const_iterator __end2;
  const_iterator __begin2;
  context_list *__range2;
  depth_first_traverser *this_local;
  
  bVar1 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(&this->stack_);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    __end2 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::begin(&this->stack_);
    t = (context *)
        std::
        vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ::end(&this->stack_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                                       *)&t), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
                 ::operator*(&__end2);
      top = (value_type *)
            __gnu_cxx::
            __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
            ::operator+(&local_38->cur,1);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                          *)&top,&local_38->end);
      if (bVar1) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>
      ::operator++(&__end2);
    }
    pvVar2 = std::
             vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ::back(&this->stack_);
    this_00 = __gnu_cxx::
              __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
              ::operator->(&pvVar2->cur);
    bVar1 = child_t<clipp::parameter,_clipp::group>::is_group(this_00);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_last_in_path() const noexcept {
            if(stack_.empty()) return false;
            for(const auto& t : stack_) {
                if(t.cur+1 != t.end) return false;
            }
            const auto& top = stack_.back();
            //if we have to descend into group on next ++ => not last in path
            if(top.cur->is_group()) return false;
            return true;
        }